

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

void __thiscall (anonymous_namespace)::Pipe::write(Pipe *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  anon_unknown.dwarf_29e54c3::Pipe::write((Pipe *)(this + -8),in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

bool write(const void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    if (closed) {
      return false;
    }
    if (bytes == 0) {
      return true;
    }
    auto notify = data.size() == 0;
    auto src = reinterpret_cast<const uint8_t*>(buffer);
    for (size_t i = 0; i < bytes; i++) {
      data.emplace_back(src[i]);
    }
    if (notify) {
      cv.notify_all();
    }
    return true;
  }